

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O1

string * __thiscall Pig::peek_abi_cxx11_(string *__return_storage_ptr__,Pig *this,int quantity)

{
  element_type *peVar1;
  
  peVar1 = (this->_text).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if ((peVar1->_M_dataplus)._M_p[this->_cursor] == '\0') {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)peVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Pig::peek (const int quantity) const
{
  std::string::size_type adjusted = std::min (static_cast <std::string::size_type> (quantity), _text->length () - _cursor);
  if ((*_text)[_cursor])
    return _text->substr (_cursor, adjusted);

  return "";
}